

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool enable_palette(AV1_COMP *cpi,_Bool is_mode_intra,BLOCK_SIZE bsize,uint source_variance,
                    int force_zeromv_skip,int skip_idtx_palette,int force_palette_test,
                    uint best_intra_sad_norm)

{
  _Bool _Var1;
  int iVar2;
  uint in_ECX;
  BLOCK_SIZE in_DL;
  byte in_SIL;
  AV1_COMP *in_RDI;
  int in_R8D;
  int in_R9D;
  uint sad_thresh;
  uint local_28;
  _Bool local_1;
  
  if ((in_RDI->sf).rt_sf.prune_palette_search_nonrd < 3) {
    local_28 = 10;
  }
  else {
    local_28 = 0xc;
    if ((in_RDI->oxcf).frm_dim_cfg.width * (in_RDI->oxcf).frm_dim_cfg.height < 0xe1001) {
      local_28 = 6;
    }
  }
  if (((in_RDI->oxcf).tool_cfg.enable_palette & 1U) == 0) {
    local_1 = false;
  }
  else {
    iVar2 = av1_allow_palette((uint)((in_RDI->common).features.allow_screen_content_tools & 1),in_DL
                             );
    if (iVar2 == 0) {
      local_1 = false;
    }
    else if (in_R9D == 0) {
      if (((in_RDI->sf).rt_sf.prune_palette_search_nonrd < 2) ||
         ((((in_RDI->rc).high_source_sad == 0 || ((in_RDI->ppi->rtc_ref).non_reference_frame == 0))
          && (in_DL < BLOCK_16X32)))) {
        _Var1 = prune_palette_testing_inter(in_RDI,in_ECX);
        if ((_Var1) && (source_variance < local_28)) {
          local_1 = false;
        }
        else if (((((in_SIL & 1) == 0) && (skip_idtx_palette == 0)) ||
                 ((in_ECX == 0 || (in_R8D != 0)))) ||
                (((in_RDI->rc).high_source_sad == 0 && (in_ECX < 0x12d)))) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static inline bool enable_palette(AV1_COMP *cpi, bool is_mode_intra,
                                  BLOCK_SIZE bsize,
                                  unsigned int source_variance,
                                  int force_zeromv_skip, int skip_idtx_palette,
                                  int force_palette_test,
                                  unsigned int best_intra_sad_norm) {
  const unsigned int sad_thresh =
      cpi->sf.rt_sf.prune_palette_search_nonrd > 2
          ? (cpi->oxcf.frm_dim_cfg.width * cpi->oxcf.frm_dim_cfg.height <=
             1280 * 720)
                ? 6
                : 12
          : 10;
  if (!cpi->oxcf.tool_cfg.enable_palette) return false;
  if (!av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                         bsize)) {
    return false;
  }
  if (skip_idtx_palette) return false;

  if (cpi->sf.rt_sf.prune_palette_search_nonrd > 1 &&
      ((cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) ||
       bsize > BLOCK_16X16)) {
    return false;
  }

  if (prune_palette_testing_inter(cpi, source_variance) &&
      best_intra_sad_norm < sad_thresh)
    return false;

  if ((is_mode_intra || force_palette_test) && source_variance > 0 &&
      !force_zeromv_skip &&
      (cpi->rc.high_source_sad || source_variance > 300)) {
    return true;
  } else {
    return false;
  }
}